

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_read_block(BGZF *fp)

{
  uint64_t *puVar1;
  uint uVar2;
  hFILE *phVar3;
  uint *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  off_t oVar11;
  size_t sVar12;
  z_stream *pzVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  off_t offset;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  char *pcVar20;
  int *piVar21;
  ulong uVar22;
  bool bVar23;
  uint8_t header [18];
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  undefined4 uStack_64;
  undefined2 uStack_60;
  short sStack_5e;
  char cStack_5c;
  char cStack_5b;
  short sStack_5a;
  ushort local_58;
  hFILE *local_48;
  ulong local_40;
  ulong local_38;
  
  phVar3 = fp->fp;
  if ((*(uint *)fp & 0x60000000) == 0) {
    pvVar6 = fp->uncompressed_block;
    uVar19 = (long)phVar3->end - (long)phVar3->begin;
    sVar12 = 0x10000;
    if (uVar19 < 0x10000) {
      sVar12 = uVar19;
    }
    memcpy(pvVar6,phVar3->begin,sVar12);
    phVar3->begin = phVar3->begin + sVar12;
    if (uVar19 < 0x10000) {
      sVar12 = hread2(phVar3,pvVar6,0x10000,sVar12);
    }
    iVar18 = (int)sVar12;
    if (iVar18 == 0) {
LAB_0013dafb:
      fp->block_length = 0;
    }
    else {
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = fp->block_address + (long)iVar18;
      fp->block_length = iVar18;
    }
LAB_0013db02:
    iVar18 = 0;
  }
  else {
    pcVar20 = phVar3->begin + (phVar3->offset - (long)phVar3->buffer);
    if (((int)*(uint *)fp < 0) && (fp->gz_stream != (z_stream *)0x0)) {
      iVar18 = inflate_gzip_block(fp,0);
      if (-1 < iVar18) {
        fp->block_length = iVar18;
        fp->block_address = (int64_t)pcVar20;
        return 0;
      }
LAB_0013dd24:
      *(byte *)fp = *(byte *)fp | 1;
    }
    else {
      if (fp->cache_size != 0) {
        puVar4 = (uint *)fp->cache;
        uVar9 = *puVar4;
        if (uVar9 == 0) {
          uVar15 = 0;
        }
        else {
          uVar17 = ((uint)((ulong)pcVar20 >> 0x21) ^ (uint)pcVar20 << 0xb ^ (uint)pcVar20) &
                   uVar9 - 1;
          iVar18 = 1;
          uVar16 = uVar17;
          do {
            uVar2 = *(uint *)(*(long *)(puVar4 + 4) + (ulong)(uVar16 >> 4) * 4);
            bVar14 = (char)uVar16 * '\x02' & 0x1e;
            uVar15 = uVar2 >> bVar14;
            if (((uVar15 & 2) != 0) ||
               (((uVar15 & 1) == 0 &&
                (*(char **)(*(long *)(puVar4 + 6) + (ulong)uVar16 * 8) == pcVar20)))) {
              uVar15 = uVar16;
              if ((uVar2 >> bVar14 & 3) != 0) {
                uVar15 = uVar9;
              }
              break;
            }
            uVar16 = uVar16 + iVar18 & uVar9 - 1;
            iVar18 = iVar18 + 1;
            uVar15 = uVar9;
          } while (uVar16 != uVar17);
        }
        if (uVar15 != uVar9) {
          piVar21 = (int *)((ulong)uVar15 * 0x18 + *(long *)(puVar4 + 8));
          if (fp->block_length != 0) {
            fp->block_offset = 0;
          }
          fp->block_address = (int64_t)pcVar20;
          fp->block_length = *piVar21;
          memcpy(fp->uncompressed_block,*(void **)(piVar21 + 2),0x10000);
          offset = *(off_t *)(piVar21 + 4);
          oVar11 = hseek(fp->fp,offset,0);
          iVar18 = (int)offset;
          if (oVar11 < 0) {
            piVar21 = piVar21 + 4;
            bgzf_read_block_cold_1();
            bVar23 = iVar18 == 0;
            do {
              if ((bVar23) && (*(int *)(*(long *)(piVar21 + 0x16) + 0x20) != 0)) {
                pvVar6 = *(void **)(piVar21 + 10);
                phVar3 = *(hFILE **)(piVar21 + 0xe);
                uVar19 = (long)phVar3->end - (long)phVar3->begin;
                sVar12 = 0xff00;
                if (uVar19 < 0xff00) {
                  sVar12 = uVar19;
                }
                memcpy(pvVar6,phVar3->begin,sVar12);
                phVar3->begin = phVar3->begin + sVar12;
                if (uVar19 < 0xff00) {
                  sVar12 = hread2(phVar3,pvVar6,0xff00,sVar12);
                }
                puVar5 = *(undefined8 **)(piVar21 + 0x16);
                *(int *)(puVar5 + 1) = (int)sVar12;
                if ((int)sVar12 == 0) {
                  return 0;
                }
                *puVar5 = *(undefined8 *)(piVar21 + 10);
              }
              do {
                iVar18 = piVar21[3];
                lVar7 = *(long *)(piVar21 + 0x16);
                *(long *)(lVar7 + 0x18) = (long)iVar18 + *(long *)(piVar21 + 8);
                *(int *)(lVar7 + 0x20) = 0x10000 - iVar18;
                iVar18 = inflate(lVar7,0);
                if (iVar18 != -5) {
                  if (iVar18 < 0) {
                    return -1;
                  }
                  iVar10 = *(int *)(*(long *)(piVar21 + 0x16) + 0x20);
                  fp = (BGZF *)((ulong)fp & 0xffffffff);
                  if (iVar10 != 0x10000) {
                    fp = (BGZF *)(ulong)(uint)-(iVar10 + -0x10000);
                  }
                  if (iVar10 != 0x10000) {
                    return (int)fp;
                  }
                }
              } while (*(int *)(*(long *)(piVar21 + 0x16) + 0x20) == 0);
              bVar23 = true;
              if (iVar18 == 1) {
                return 0x10000 - *(int *)(*(long *)(piVar21 + 0x16) + 0x20);
              }
            } while( true );
          }
          if (*piVar21 != 0) {
            return 0;
          }
        }
      }
      phVar3 = fp->fp;
      uVar19 = (long)phVar3->end - (long)phVar3->begin;
      sVar12 = 0x12;
      if (uVar19 < 0x12) {
        sVar12 = uVar19;
      }
      memcpy(&local_68,phVar3->begin,sVar12);
      phVar3->begin = phVar3->begin + sVar12;
      if (uVar19 < 0x12) {
        sVar12 = hread2(phVar3,&local_68,0x12,sVar12);
      }
      if ((int)sVar12 == 0) goto LAB_0013dafb;
      if ((int)sVar12 == 0x12) {
        iVar18 = -2;
        if ((((local_68 == '\x1f') && (cStack_67 == -0x75)) && (cStack_66 == '\b')) &&
           (((iVar18 = -1, (bStack_65 & 4) != 0 && (sStack_5e == 6)) &&
            ((cStack_5c == 'B' && (cStack_5b == 'C')))))) {
          iVar18 = -(uint)(sStack_5a != 2);
        }
        if (iVar18 == -1) {
          puVar5 = (undefined8 *)fp->compressed_block;
          *(ushort *)(puVar5 + 2) = local_58;
          *puVar5 = CONCAT44(uStack_64,
                             CONCAT13(bStack_65,CONCAT12(cStack_66,CONCAT11(cStack_67,local_68))));
          puVar5[1] = CONCAT26(sStack_5a,
                               CONCAT15(cStack_5b,CONCAT14(cStack_5c,CONCAT22(sStack_5e,uStack_60)))
                              );
          phVar3 = fp->fp;
          local_48 = (hFILE *)((long)puVar5 + 0x12);
          uVar19 = (long)phVar3->end - (long)phVar3->begin;
          sVar12 = 0xfeee;
          if (uVar19 < 0xfeee) {
            sVar12 = uVar19;
          }
          memcpy(local_48,phVar3->begin,sVar12);
          phVar3->begin = phVar3->begin + sVar12;
          if (uVar19 < 0xfeee) {
            sVar12 = hread2(phVar3,local_48,0xfeee,sVar12);
          }
          uVar19 = 10;
          if ((bStack_65 & 4) != 0) {
            uVar19 = (ulong)(*(ushort *)((long)puVar5 + 10) + 0xc);
          }
          if ((bStack_65 & 8) != 0) {
            if ((uint)uVar19 < 0xff00) {
              do {
                if (*(char *)((long)puVar5 + uVar19) == '\0') goto LAB_0013dbb7;
                uVar19 = uVar19 + 1;
              } while (uVar19 != 0xff00);
              uVar19 = 0xff00;
            }
LAB_0013dbb7:
            if ((int)uVar19 == 0xff00) goto LAB_0013daf3;
            uVar19 = (ulong)((int)uVar19 + 1);
          }
          iVar18 = (int)uVar19;
          if ((bStack_65 & 0x10) != 0) {
            if (iVar18 < 0xff00) {
              do {
                if (*(char *)((long)puVar5 + uVar19) == '\0') goto LAB_0013dcdd;
                uVar19 = uVar19 + 1;
              } while (uVar19 != 0xff00);
              uVar19 = 0xff00;
            }
LAB_0013dcdd:
            if ((int)uVar19 == 0xff00) goto LAB_0013daf3;
            iVar18 = (int)uVar19 + 1;
          }
          fp->field_0x3 = fp->field_0x3 | 0x80;
          pzVar13 = (z_stream *)calloc(1,0x70);
          fp->gz_stream = pzVar13;
          iVar10 = inflateInit2_(pzVar13,0xfffffff1,"1.2.11",0x70);
          if (iVar10 == 0) {
            iVar18 = iVar18 + (bStack_65 & 2);
            pzVar13 = fp->gz_stream;
            pzVar13->avail_in = ((int)sVar12 + 0x12) - iVar18;
            pzVar13->next_in = (Bytef *)((long)puVar5 + (long)iVar18);
            iVar18 = inflate_gzip_block(fp,1);
            if (-1 < iVar18) {
              fp->block_length = iVar18;
              fp->block_address = (int64_t)pcVar20;
              return -(uint)(fp->idx_build_otf != 0);
            }
          }
          goto LAB_0013dd24;
        }
        if (iVar18 != -2) {
          local_40 = (ulong)local_58;
          puVar5 = (undefined8 *)fp->compressed_block;
          *(ushort *)(puVar5 + 2) = local_58;
          *puVar5 = CONCAT44(uStack_64,
                             CONCAT13(bStack_65,CONCAT12(cStack_66,CONCAT11(cStack_67,local_68))));
          puVar5[1] = CONCAT26(sStack_5a,
                               CONCAT15(cStack_5b,CONCAT14(cStack_5c,CONCAT22(sStack_5e,uStack_60)))
                              );
          local_38 = local_40 - 0x11;
          local_48 = fp->fp;
          uVar22 = (long)local_48->end - (long)local_48->begin;
          uVar19 = local_38;
          if (uVar22 < local_38) {
            uVar19 = uVar22;
          }
          memcpy((void *)((long)puVar5 + 0x12),local_48->begin,uVar19);
          uVar8 = local_38;
          local_48->begin = local_48->begin + uVar19;
          if (uVar22 < local_38) {
            uVar19 = hread2(local_48,(void *)((long)puVar5 + 0x12),local_38,uVar19);
          }
          if ((int)uVar8 == (int)uVar19) {
            uVar9 = inflate_block(fp,(int)local_40 + 1);
            if (-1 < (int)uVar9) {
              if (fp->block_length != 0) {
                fp->block_offset = 0;
              }
              fp->block_address = (int64_t)pcVar20;
              fp->block_length = uVar9;
              if (fp->idx_build_otf != 0) {
                bgzf_index_add_block(fp);
                puVar1 = &fp->idx->ublock_addr;
                *puVar1 = *puVar1 + (ulong)uVar9;
              }
              cache_block(fp,(int)uVar19 + 0x12);
              goto LAB_0013db02;
            }
          }
          else {
            *(byte *)fp = *(byte *)fp | 4;
          }
          goto LAB_0013dd27;
        }
      }
LAB_0013daf3:
      *(byte *)fp = *(byte *)fp | 2;
    }
LAB_0013dd27:
    iVar18 = -1;
  }
  return iVar18;
}

Assistant:

int bgzf_read_block(BGZF *fp)
{
    uint8_t header[BLOCK_HEADER_LENGTH], *compressed_block;
    int count, size = 0, block_length, remaining;

    // Reading an uncompressed file
    if ( !fp->is_compressed )
    {
        count = hread(fp->fp, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
        if ( count==0 )
        {
            fp->block_length = 0;
            return 0;
        }
        if (fp->block_length != 0) fp->block_offset = 0;
        fp->block_address += count;
        fp->block_length = count;
        return 0;
    }

    // Reading compressed file
    int64_t block_address;
    block_address = htell(fp->fp);
    if ( fp->is_gzip && fp->gz_stream ) // is this is a initialized gzip stream?
    {
        count = inflate_gzip_block(fp, 0);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        return 0;
    }
    if (fp->cache_size && load_block_from_cache(fp, block_address)) return 0;
    count = hread(fp->fp, header, sizeof(header));
    if (count == 0) { // no data read
        fp->block_length = 0;
        return 0;
    }
    int ret;
    if ( count != sizeof(header) || (ret=check_header(header))==-2 )
    {
        fp->errcode |= BGZF_ERR_HEADER;
        return -1;
    }
    if ( ret==-1 )
    {
        // GZIP, not BGZF
        uint8_t *cblock = (uint8_t*)fp->compressed_block;
        memcpy(cblock, header, sizeof(header));
        count = hread(fp->fp, cblock+sizeof(header), BGZF_BLOCK_SIZE - sizeof(header)) + sizeof(header);
        int nskip = 10;

        // Check optional fields to skip: FLG.FNAME,FLG.FCOMMENT,FLG.FHCRC,FLG.FEXTRA
        // Note: Some of these fields are untested, I did not have appropriate data available
        if ( header[3] & 0x4 ) // FLG.FEXTRA
        {
            nskip += unpackInt16(&cblock[nskip]) + 2;
        }
        if ( header[3] & 0x8 ) // FLG.FNAME
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x10 ) // FLG.FCOMMENT
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x2 ) nskip += 2;  //  FLG.FHCRC

        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*) calloc(1,sizeof(z_stream));
        int ret = inflateInit2(fp->gz_stream, -15);
        if (ret != Z_OK)
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->gz_stream->avail_in = count - nskip;
        fp->gz_stream->next_in  = cblock + nskip;
        count = inflate_gzip_block(fp, 1);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        if ( fp->idx_build_otf ) return -1; // cannot build index for gzip
        return 0;
    }
    size = count;
    block_length = unpackInt16((uint8_t*)&header[16]) + 1; // +1 because when writing this number, we used "-1"
    compressed_block = (uint8_t*)fp->compressed_block;
    memcpy(compressed_block, header, BLOCK_HEADER_LENGTH);
    remaining = block_length - BLOCK_HEADER_LENGTH;
    count = hread(fp->fp, &compressed_block[BLOCK_HEADER_LENGTH], remaining);
    if (count != remaining) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    size += count;
    if ((count = inflate_block(fp, block_length)) < 0) return -1;
    if (fp->block_length != 0) fp->block_offset = 0; // Do not reset offset if this read follows a seek.
    fp->block_address = block_address;
    fp->block_length = count;
    if ( fp->idx_build_otf )
    {
        bgzf_index_add_block(fp);
        fp->idx->ublock_addr += count;
    }
    cache_block(fp, size);
    return 0;
}